

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorRefactor.cpp
# Opt level: O0

HighsInt __thiscall HFactor::rebuild(HFactor *this,HighsTimerClock *factor_timer_clock_pointer)

{
  value_type vVar1;
  double dVar2;
  value_type vVar3;
  int iVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  long in_RDI;
  reference rVar10;
  reference rVar11;
  reference rVar12;
  HighsInt local_iRow_2;
  HighsInt k_5;
  HighsInt p1_1;
  HighsInt p0_1;
  HighsInt section_1;
  double pivot_multiplier_1;
  double abs_pivot_1;
  HighsInt k_4;
  HighsInt pivot_k_1;
  double local_density;
  HighsInt local_iRow_1;
  HighsInt iEl;
  HighsInt end_1;
  HighsInt start_2;
  int8_t pivot_type_1;
  HighsInt iVar_1;
  HighsInt iRow_2;
  HighsInt iK_3;
  HVector column;
  double expected_density;
  vector<bool,_std::allocator<bool>_> not_in_bump;
  HighsInt iRow_1;
  HighsInt iK_2;
  HighsInt iK_1;
  HighsInt k_3;
  HighsInt k_2;
  HighsInt local_iRow;
  HighsInt k_1;
  HighsInt p1;
  HighsInt p0;
  HighsInt section;
  double pivot_multiplier;
  double abs_pivot;
  HighsInt k;
  HighsInt pivot_k;
  HighsInt end;
  HighsInt start_1;
  HighsInt count;
  HighsInt start;
  int8_t pivot_type;
  HighsInt iVar;
  HighsInt iRow;
  HighsInt iK;
  bool report_anything;
  bool report_markowitz;
  bool report_singletons;
  bool report_unit;
  vector<bool,_std::allocator<bool>_> has_pivot;
  HighsInt rank_deficiency;
  HighsInt stage;
  bool report_lu;
  value_type_conflict1 *in_stack_fffffffffffffc58;
  HFactor *in_stack_fffffffffffffc60;
  vector<int,_std::allocator<int>_> *this_00;
  value_type_conflict1 *in_stack_fffffffffffffc68;
  HVectorBase<double> *in_stack_fffffffffffffc70;
  size_type in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  value_type in_stack_fffffffffffffc84;
  HVectorBase<double> *in_stack_fffffffffffffc90;
  int local_354;
  HighsTimerClock *in_stack_fffffffffffffd18;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffd20;
  _Bit_type in_stack_fffffffffffffd28;
  _Bit_type *in_stack_fffffffffffffd30;
  int local_2c8;
  int local_2c4;
  reference local_2a0;
  undefined4 local_28c;
  double local_288;
  HFactor *in_stack_fffffffffffffd80;
  int local_268;
  int local_25c;
  int local_248;
  int local_244;
  reference local_238;
  value_type local_228;
  int local_224;
  int local_220;
  int local_21c;
  value_type local_215;
  value_type local_214;
  value_type local_210;
  int local_20c;
  int local_204;
  vector<int,_std::allocator<int>_> local_200;
  vector<double,_std::allocator<double>_> local_1e8 [6];
  double local_158;
  int local_124;
  int local_120;
  int local_11c;
  reference local_118;
  undefined4 local_108;
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  double local_f0;
  reference local_e8;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  double local_c0;
  int local_b4;
  double local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  char local_75;
  int local_74;
  value_type local_70;
  int local_6c;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_51;
  int local_24;
  int local_20;
  undefined1 local_19;
  int local_4;
  
  local_19 = 0;
  luClear(in_stack_fffffffffffffc60);
  *(undefined4 *)(in_RDI + 0x1a8) = 0;
  *(undefined4 *)(in_RDI + 0xb8) = 0;
  local_20 = *(int *)(in_RDI + 200);
  local_24 = 0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x7dc6dd);
  local_51 = 0;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc60,
             (size_type)in_stack_fffffffffffffc58,(bool *)0x7dc709);
  rVar10._M_mask = in_stack_fffffffffffffd28;
  rVar10._M_p = in_stack_fffffffffffffd30;
  local_65 = 0;
  local_66 = 0;
  local_67 = 0;
  local_68 = 0;
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0xb0);
  for (local_6c = 0; local_6c < *(int *)(in_RDI + 200); local_6c = local_6c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)local_6c);
    local_70 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)local_6c);
    local_74 = *pvVar6;
    pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x98),
                        (long)local_6c);
    local_75 = *pvVar7;
    if ((local_75 == '\0') || (local_75 == '\x01')) {
      if (local_75 == '\0') {
        *(int *)(in_RDI + 0xb8) = *(int *)(in_RDI + 0xb8) + 1;
      }
      else if (local_75 == '\x01') {
        local_7c = *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_74 * 4);
        local_80 = *(int *)(*(long *)(in_RDI + 0xe8) + (long)(local_74 + 1) * 4) - local_7c;
        *(int *)(in_RDI + 0xb8) = *(int *)(in_RDI + 0xb8) + 1;
      }
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
      local_84 = (undefined4)sVar8;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                 (value_type_conflict2 *)in_stack_fffffffffffffc58);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                 (value_type_conflict2 *)in_stack_fffffffffffffc68);
      local_90 = 0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                 in_stack_fffffffffffffc58);
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
      local_94 = (undefined4)sVar8;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                 (value_type_conflict2 *)in_stack_fffffffffffffc58);
    }
    else {
      if ((local_75 != '\x02') && (local_75 != '\x03')) {
        local_20 = local_6c;
        break;
      }
      local_98 = *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_74 * 4);
      local_9c = *(int *)(*(long *)(in_RDI + 0xe8) + (long)(local_74 + 1) * 4);
      local_a0 = -1;
      for (local_a4 = local_98; local_a4 < local_9c; local_a4 = local_a4 + 1) {
        if (*(int *)(*(long *)(in_RDI + 0xf0) + (long)local_a4 * 4) == local_70) {
          local_a0 = local_a4;
          break;
        }
      }
      local_b0 = ABS(*(double *)(*(long *)(in_RDI + 0xf8) + (long)local_a0 * 8));
      if (local_b0 < *(double *)(in_RDI + 0x110)) {
        local_24 = *(int *)(in_RDI + 0x1a8) + 1;
        local_b4 = 1;
        local_4 = local_24;
        goto LAB_007ddb45;
      }
      iVar4 = local_98;
      if (local_75 == '\x02') {
        local_c0 = 1.0 / *(double *)(*(long *)(in_RDI + 0xf8) + (long)local_a0 * 8);
        for (local_c4 = 0; local_c4 < 2; local_c4 = local_c4 + 1) {
          if (local_c4 == 0) {
            local_2c4 = local_98;
          }
          else {
            local_2c4 = local_a0 + 1;
          }
          local_c8 = local_2c4;
          if (local_c4 == 0) {
            local_2c8 = local_a0;
          }
          else {
            local_2c8 = local_9c;
          }
          local_cc = local_2c8;
          for (local_d0 = local_2c4; local_d0 < local_cc; local_d0 = local_d0 + 1) {
            local_d4 = *(undefined4 *)(*(long *)(in_RDI + 0xf0) + (long)local_d0 * 4);
            rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                in_stack_fffffffffffffc78);
            local_e8 = rVar10;
            bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_e8);
            if (((bVar5 ^ 0xffU) & 1) == 0) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                         (value_type_conflict2 *)in_stack_fffffffffffffc68);
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                         in_stack_fffffffffffffc68);
            }
            else {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                         (value_type_conflict2 *)in_stack_fffffffffffffc68);
              local_f0 = *(double *)(*(long *)(in_RDI + 0xf8) + (long)local_d0 * 8) * local_c0;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                         in_stack_fffffffffffffc58);
            }
          }
        }
        in_stack_fffffffffffffd20 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 0x498);
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
        local_f4 = (undefined4)sVar8;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                   (value_type_conflict2 *)in_stack_fffffffffffffc58);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                   (value_type_conflict2 *)in_stack_fffffffffffffc68);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                   in_stack_fffffffffffffc68);
        in_stack_fffffffffffffd18 = (HighsTimerClock *)(in_RDI + 0x578);
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
        local_f8 = (undefined4)sVar8;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                   (value_type_conflict2 *)in_stack_fffffffffffffc58);
      }
      else {
        while (local_fc = iVar4, iVar4 = local_a0, local_fc < local_a0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                     (value_type_conflict2 *)in_stack_fffffffffffffc68);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                     in_stack_fffffffffffffc68);
          iVar4 = local_fc + 1;
        }
        while (local_100 = iVar4 + 1, local_100 < local_9c) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                     (value_type_conflict2 *)in_stack_fffffffffffffc68);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                     in_stack_fffffffffffffc68);
          iVar4 = local_100;
        }
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
        local_104 = (undefined4)sVar8;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                   (value_type_conflict2 *)in_stack_fffffffffffffc58);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                   (value_type_conflict2 *)in_stack_fffffffffffffc68);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                   in_stack_fffffffffffffc68);
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
        local_108 = (undefined4)sVar8;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                   (value_type_conflict2 *)in_stack_fffffffffffffc58);
      }
    }
    *(int *)(*(long *)(in_RDI + 0x100) + (long)local_70 * 4) = local_74;
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                        in_stack_fffffffffffffc78);
    local_118 = rVar11;
    std::_Bit_reference::operator=(&local_118,true);
  }
  if (local_20 < *(int *)(in_RDI + 200)) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78);
    for (local_11c = local_20; local_11c < *(int *)(in_RDI + 200); local_11c = local_11c + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x498),(long)local_11c);
      vVar3 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x498),
                          (long)(local_11c + 1));
      *pvVar6 = vVar3;
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78);
    for (local_120 = 0; local_120 < *(int *)(in_RDI + 200); local_120 = local_120 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)local_120);
      vVar3 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x480),(long)local_120);
      *pvVar6 = vVar3;
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78);
    for (local_124 = 0; local_124 < *(int *)(in_RDI + 200); local_124 = local_124 + 1) {
      if (local_124 < local_20) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x480),(long)local_124);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x468),(long)*pvVar6);
      }
      iVar4 = local_124;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x480),(long)local_124);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x468),(long)*pvVar6);
      *pvVar6 = iVar4;
    }
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffd20,
               (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd18);
    local_158 = 0.0;
    HVectorBase<double>::HVectorBase((HVectorBase<double> *)in_stack_fffffffffffffc60);
    HVectorBase<double>::setup
              (in_stack_fffffffffffffc70,(HighsInt)((ulong)in_stack_fffffffffffffc68 >> 0x20));
    rVar11._M_mask = (_Bit_type)in_stack_fffffffffffffc60;
    rVar11._M_p = (_Bit_type *)in_stack_fffffffffffffc68;
    for (local_20c = local_20; local_20c < *(int *)(in_RDI + 200); local_20c = local_20c + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)local_20c);
      local_210 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)local_20c);
      local_214 = *pvVar6;
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x98),
                          (long)local_20c);
      local_215 = *pvVar7;
      HVectorBase<double>::clear
                ((HVectorBase<double> *)
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
      local_224 = *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_214 * 4);
      local_220 = *(int *)(*(long *)(in_RDI + 0xe8) + (long)(local_214 + 1) * 4);
      local_21c = local_224;
      while( true ) {
        if (local_220 <= local_224) break;
        local_228 = *(value_type *)(*(long *)(in_RDI + 0xf0) + (long)local_224 * 4);
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                            in_stack_fffffffffffffc78);
        local_238 = rVar12;
        bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_238);
        vVar3 = local_228;
        if (bVar5) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                     (value_type_conflict2 *)rVar11._M_p);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                     (value_type_conflict1 *)rVar11._M_p);
        }
        else {
          sVar8 = (size_type)local_204;
          local_204 = local_204 + 1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_200,sVar8);
          *pvVar6 = vVar3;
          vVar1 = *(value_type *)(*(long *)(in_RDI + 0xf8) + (long)local_224 * 8);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_1e8,(long)local_228);
          *pvVar9 = vVar1;
        }
        local_224 = local_224 + 1;
      }
      ftranL((HFactor *)rVar10._M_p,(HVector *)rVar10._M_mask,(double)in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18);
      local_158 = ((double)local_204 / (double)*(int *)(in_RDI + 200)) * 0.05 + local_158 * 0.95;
      HVectorBase<double>::tight(in_stack_fffffffffffffc90);
      local_244 = -1;
      local_21c = 0;
      local_220 = local_204;
      for (local_248 = 0; local_248 < local_220; local_248 = local_248 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_200,(long)local_248);
        if (*pvVar6 == local_210) {
          local_244 = local_248;
          break;
        }
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_1e8,(long)local_210);
      if (ABS(*pvVar9) < *(double *)(in_RDI + 0x110)) {
        local_24 = *(int *)(in_RDI + 200) - local_20c;
        local_b4 = 1;
        local_4 = local_24;
        goto LAB_007ddaf7;
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_1e8,(long)local_210);
      dVar2 = *pvVar9;
      for (local_25c = 0; local_25c < 2; local_25c = local_25c + 1) {
        if (local_25c == 0) {
          local_354 = local_244;
          local_268 = local_21c;
        }
        else {
          local_268 = local_244 + 1;
          local_354 = local_220;
        }
        for (; local_268 < local_354; local_268 = local_268 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_200,(long)local_268);
          iVar4 = *pvVar6;
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                              in_stack_fffffffffffffc78);
          in_stack_fffffffffffffd80 = (HFactor *)rVar12._M_p;
          bVar5 = std::_Bit_reference::operator_cast_to_bool
                            ((_Bit_reference *)&stack0xfffffffffffffd80);
          if (((bVar5 ^ 0xffU) & 1) == 0) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                       (value_type_conflict2 *)rVar11._M_p);
            std::vector<double,_std::allocator<double>_>::operator[](local_1e8,(long)iVar4);
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                       (value_type_conflict1 *)rVar11._M_p);
          }
          else {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                       (value_type_conflict2 *)rVar11._M_p);
            in_stack_fffffffffffffc90 = (HVectorBase<double> *)(in_RDI + 0x4c8);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_1e8,(long)iVar4)
            ;
            local_288 = *pvVar9 * (1.0 / dVar2);
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)rVar11._M_mask,
                       in_stack_fffffffffffffc58);
          }
        }
      }
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
      in_stack_fffffffffffffc84 = (value_type)sVar8;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x498),
                          (long)(local_20c + 1));
      *pvVar6 = in_stack_fffffffffffffc84;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                 (value_type_conflict2 *)rVar11._M_p);
      in_stack_fffffffffffffc78 = in_RDI + 0x558;
      std::vector<double,_std::allocator<double>_>::operator[](local_1e8,(long)local_210);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                 (value_type_conflict1 *)rVar11._M_p);
      this_00 = (vector<int,_std::allocator<int>_> *)rVar11._M_mask;
      in_stack_fffffffffffffc70 = (HVectorBase<double> *)(in_RDI + 0x578);
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
      local_28c = (undefined4)sVar8;
      std::vector<int,_std::allocator<int>_>::push_back
                (this_00,(value_type_conflict2 *)in_stack_fffffffffffffc58);
      *(value_type *)(*(long *)(in_RDI + 0x100) + (long)local_210 * 4) = local_214;
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                          in_stack_fffffffffffffc78);
      local_2a0 = rVar11;
      std::_Bit_reference::operator=(&local_2a0,true);
    }
    local_b4 = 0;
LAB_007ddaf7:
    HVectorBase<double>::~HVectorBase((HVectorBase<double> *)rVar11._M_mask);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x7ddb11);
    if (local_b4 != 0) goto LAB_007ddb45;
  }
  buildFinish(in_stack_fffffffffffffd80);
  local_4 = 0;
  local_b4 = 1;
LAB_007ddb45:
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x7ddb52)
  ;
  return local_4;
}

Assistant:

HighsInt HFactor::rebuild(HighsTimerClock* factor_timer_clock_pointer) {
  const bool report_lu = false;
  // Check that the refactorization information should be used
  assert(refactor_info_.use);
  /**
   * 0. Clear L and U factor
   */
  luClear();

  nwork = 0;
  basis_matrix_num_el = 0;
  HighsInt stage = num_row;
  HighsInt rank_deficiency = 0;
  vector<bool> has_pivot;
  has_pivot.assign(num_row, false);
  const bool report_unit = false;
  const bool report_singletons = false;
  const bool report_markowitz = false;
  const bool report_anything =
      report_unit || report_singletons || report_markowitz;
  if (report_anything) printf("\nRefactor\n");
  // Take build_synthetic_tick from the refactor info so that this
  // refactorization doesn't look unrealistically cheap.
  this->build_synthetic_tick = this->refactor_info_.build_synthetic_tick;
  // Check that the refactorization info has been set up
  assert((int)this->refactor_info_.pivot_row.size() >= num_row);
  assert((int)this->refactor_info_.pivot_var.size() >= num_row);
  assert((int)this->refactor_info_.pivot_type.size() >= num_row);
  for (HighsInt iK = 0; iK < num_row; iK++) {
    HighsInt iRow = this->refactor_info_.pivot_row[iK];
    HighsInt iVar = this->refactor_info_.pivot_var[iK];
    int8_t pivot_type = this->refactor_info_.pivot_type[iK];
    assert(!has_pivot[iRow]);

    if (pivot_type == kPivotLogical || pivot_type == kPivotUnit) {
      if (pivot_type == kPivotLogical) {
        //
        // 1.1 Logical column
        if (report_unit) printf("Stage %d: Logical\n", (int)iK);
        assert(iVar >= num_col);
        basis_matrix_num_el++;
      } else if (pivot_type == kPivotUnit) {
        //
        // 1.2 (Structural) unit column
        if (report_unit) printf("Stage %d: Unit\n", (int)iK);
        assert(iVar < num_col);
        HighsInt start = a_start[iVar];
        HighsInt count = a_start[iVar + 1] - start;
        assert(a_index[start] == iRow);
        assert(count == 1 && a_value[start] == 1);
        basis_matrix_num_el++;
      }
      // 1.3 Record unit column
      l_start.push_back(l_index.size());
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(1);
      u_start.push_back(u_index.size());
    } else if (pivot_type == kPivotRowSingleton ||
               pivot_type == kPivotColSingleton) {
      //
      // Row or column singleton
      assert(iVar < num_col);
      const HighsInt start = a_start[iVar];
      const HighsInt end = a_start[iVar + 1];
      // Find where the pivot is
      HighsInt pivot_k = -1;
      for (HighsInt k = start; k < end; k++) {
        if (a_index[k] == iRow) {
          pivot_k = k;
          break;
        }
      }
      assert(pivot_k >= 0);
      // Check that the pivot isn't too small. Shouldn't happen since
      // this is refactorization
      double abs_pivot = std::fabs(a_value[pivot_k]);
      assert(abs_pivot >= pivot_tolerance);
      if (abs_pivot < pivot_tolerance) {
        rank_deficiency = nwork + 1;
        return rank_deficiency;
      }
      if (pivot_type == kPivotRowSingleton) {
        //
        // 2.2 Deal with row singleton
        const double pivot_multiplier = 1 / a_value[pivot_k];
        if (report_singletons)
          printf("Stage %d: Row singleton (%4d, %g)\n", (int)iK, (int)pivot_k,
                 pivot_multiplier);
        for (HighsInt section = 0; section < 2; section++) {
          HighsInt p0 = section == 0 ? start : pivot_k + 1;
          HighsInt p1 = section == 0 ? pivot_k : end;
          for (HighsInt k = p0; k < p1; k++) {
            HighsInt local_iRow = a_index[k];
            if (!has_pivot[local_iRow]) {
              if (report_singletons)
                printf("Row singleton: L En (%4d, %11.4g)\n", (int)local_iRow,
                       a_value[k] * pivot_multiplier);
              l_index.push_back(local_iRow);
              l_value.push_back(a_value[k] * pivot_multiplier);
            } else {
              if (report_singletons)
                printf("Row singleton: U En (%4d, %11.4g)\n", (int)local_iRow,
                       a_value[k]);
              u_index.push_back(local_iRow);
              u_value.push_back(a_value[k]);
            }
          }
        }
        l_start.push_back(l_index.size());
        if (report_singletons)
          printf("Row singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 a_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(a_value[pivot_k]);
        u_start.push_back(u_index.size());
      } else {
        //
        // 2.3 Deal with column singleton
        if (report_singletons) printf("Stage %d: Col singleton\n", (int)iK);
        for (HighsInt k = start; k < pivot_k; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)a_index[k],
                   a_value[k]);
          u_index.push_back(a_index[k]);
          u_value.push_back(a_value[k]);
        }
        for (HighsInt k = pivot_k + 1; k < end; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)a_index[k],
                   a_value[k]);
          u_index.push_back(a_index[k]);
          u_value.push_back(a_value[k]);
        }
        l_start.push_back(l_index.size());
        if (report_singletons)
          printf("Col singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 a_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(a_value[pivot_k]);
        u_start.push_back(u_index.size());
      }
    } else {
      assert(pivot_type == kPivotMarkowitz);
      stage = iK;
      break;
    }
    basic_index[iRow] = iVar;
    has_pivot[iRow] = true;
  }
  if (report_lu) {
    printf("\nAfter units and singletons\n");
    reportLu(kReportLuBoth, false);
  }
  if (stage < num_row) {
    // Handle the remaining Markowitz pivots
    //
    // First of all complete the L factor with identity columns so
    // that FtranL counts the RHS entries in rows that don't yet have
    // picots by running to completion. In the hyper-sparse code,
    // these will HOPEFULLY be skipped
    //
    // There are already l_start entries for the first stage rows, but
    // l_pivot_index is not assigned, as u_pivot_index gets copied into it
    l_start.resize(num_row + 1);
    for (HighsInt iK = stage; iK < num_row; iK++) l_start[iK + 1] = l_start[iK];
    l_pivot_index.resize(num_row);
    for (HighsInt iK = 0; iK < num_row; iK++)
      l_pivot_index[iK] = this->refactor_info_.pivot_row[iK];
    // To do hyper-sparse FtranL operations, have to set up l_pivot_lookup.
    l_pivot_lookup.resize(num_row);
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow < stage) {
        if (l_pivot_lookup[l_pivot_index[iRow]] != iRow) {
          // printf("Strange: Thought that l_pivot_lookup[l_pivot_index[iRow]]
          // == iRow\n");
        }
      }
      l_pivot_lookup[l_pivot_index[iRow]] = iRow;
    }
    // Need to know whether to consider matrix entries for FtranL
    // operation. Initially these correspond to all the rows without
    // pivots
    vector<bool> not_in_bump = has_pivot;
    // Monitor density of FtranL result to possibly switch from exploiting
    // hyper-sparsity
    double expected_density = 0.0;
    // Initialise a HVector in which the L and U entries of the
    // pivotal column will be formed
    HVector column;
    column.setup(num_row);
    for (HighsInt iK = stage; iK < num_row; iK++) {
      HighsInt iRow = this->refactor_info_.pivot_row[iK];
      HighsInt iVar = this->refactor_info_.pivot_var[iK];
      int8_t pivot_type = this->refactor_info_.pivot_type[iK];
      assert(!has_pivot[iRow]);
      assert(pivot_type == kPivotMarkowitz);
      // Set up the column for the FtranL. It contains the matrix
      // entries in rows without pivots, and the remaining entries
      // start forming the U column
      column.clear();
      HighsInt start = a_start[iVar];
      HighsInt end = a_start[iVar + 1];
      for (HighsInt iEl = start; iEl < end; iEl++) {
        HighsInt local_iRow = a_index[iEl];
        if (not_in_bump[local_iRow]) {
          u_index.push_back(local_iRow);
          u_value.push_back(a_value[iEl]);
        } else {
          column.index[column.count++] = local_iRow;
          column.array[local_iRow] = a_value[iEl];
        }
      }
      // Perform FtranL, but don't time it!
      ftranL(column, expected_density);
      // Update the running average density
      double local_density = (1.0 * column.count) / num_row;
      expected_density = kRunningAverageMultiplier * local_density +
                         (1 - kRunningAverageMultiplier) * expected_density;
      // Strip out small values
      column.tight();
      // Now form the column of L
      //
      // Find the pivot
      HighsInt pivot_k = -1;
      start = 0;
      end = column.count;
      for (HighsInt k = start; k < end; k++) {
        if (column.index[k] == iRow) {
          pivot_k = k;
          break;
        }
      }
      assert(pivot_k >= 0);
      // Check that the pivot isn't too small. Shouldn't happen since
      // this is refactorization
      double abs_pivot = std::fabs(column.array[iRow]);
      assert(abs_pivot >= pivot_tolerance);
      if (abs_pivot < pivot_tolerance) {
        rank_deficiency = num_row - iK;
        return rank_deficiency;
      }
      const double pivot_multiplier = 1 / column.array[iRow];
      for (HighsInt section = 0; section < 2; section++) {
        HighsInt p0 = section == 0 ? start : pivot_k + 1;
        HighsInt p1 = section == 0 ? pivot_k : end;
        for (HighsInt k = p0; k < p1; k++) {
          HighsInt local_iRow = column.index[k];
          if (!has_pivot[local_iRow]) {
            l_index.push_back(local_iRow);
            l_value.push_back(column.array[local_iRow] * pivot_multiplier);
          } else {
            u_index.push_back(local_iRow);
            u_value.push_back(column.array[local_iRow]);
          }
        }
      }
      l_start[iK + 1] = l_index.size();
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(column.array[iRow]);
      u_start.push_back(u_index.size());
      basic_index[iRow] = iVar;
      has_pivot[iRow] = true;
      if (report_lu) {
        printf("\nAfter Markowitz %d\n", (int)(iK - stage));
        reportLu(kReportLuBoth, false);
      }
    }
  }
  if (report_lu) {
    printf("\nRefactored INVERT\n");
    reportLu(kReportLuBoth, false);
  }
  buildFinish();
  return 0;
}